

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

void __thiscall wabt::interp::Thread::Thread(Thread *this,Store *store,Stream *trace_stream)

{
  TraceSource *pTVar1;
  _Head_base<0UL,_wabt::interp::Thread::TraceSource_*,_false> _Var2;
  _Head_base<0UL,_wabt::interp::Thread::TraceSource_*,_false> local_28;
  Thread *local_20;
  
  (this->exceptions_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->exceptions_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->refs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->exceptions_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->refs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->refs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->values_).super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->values_).super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->frames_).super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->values_).super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->frames_).super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->frames_).super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->store_ = store;
  this->inst_ = (Instance *)0x0;
  this->mod_ = (Module *)0x0;
  this->trace_stream_ = trace_stream;
  (this->trace_source_)._M_t.
  super___uniq_ptr_impl<wabt::interp::Thread::TraceSource,_std::default_delete<wabt::interp::Thread::TraceSource>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::interp::Thread::TraceSource_*,_std::default_delete<wabt::interp::Thread::TraceSource>_>
  .super__Head_base<0UL,_wabt::interp::Thread::TraceSource_*,_false>._M_head_impl =
       (TraceSource *)0x0;
  local_28._M_head_impl = (TraceSource *)this;
  std::
  _Rb_tree<wabt::interp::Thread*,wabt::interp::Thread*,std::_Identity<wabt::interp::Thread*>,std::less<wabt::interp::Thread*>,std::allocator<wabt::interp::Thread*>>
  ::_M_insert_unique<wabt::interp::Thread*>
            ((_Rb_tree<wabt::interp::Thread*,wabt::interp::Thread*,std::_Identity<wabt::interp::Thread*>,std::less<wabt::interp::Thread*>,std::allocator<wabt::interp::Thread*>>
              *)&store->threads_,(Thread **)&local_28);
  std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::reserve
            (&this->frames_,0x666);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::reserve
            (&this->values_,0x1000);
  if (trace_stream != (Stream *)0x0) {
    local_20 = this;
    std::make_unique<wabt::interp::Thread::TraceSource,wabt::interp::Thread*>((Thread **)&local_28);
    _Var2._M_head_impl = local_28._M_head_impl;
    local_28._M_head_impl = (TraceSource *)0x0;
    pTVar1 = (this->trace_source_)._M_t.
             super___uniq_ptr_impl<wabt::interp::Thread::TraceSource,_std::default_delete<wabt::interp::Thread::TraceSource>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::interp::Thread::TraceSource_*,_std::default_delete<wabt::interp::Thread::TraceSource>_>
             .super__Head_base<0UL,_wabt::interp::Thread::TraceSource_*,_false>._M_head_impl;
    (this->trace_source_)._M_t.
    super___uniq_ptr_impl<wabt::interp::Thread::TraceSource,_std::default_delete<wabt::interp::Thread::TraceSource>_>
    ._M_t.
    super__Tuple_impl<0UL,_wabt::interp::Thread::TraceSource_*,_std::default_delete<wabt::interp::Thread::TraceSource>_>
    .super__Head_base<0UL,_wabt::interp::Thread::TraceSource_*,_false>._M_head_impl =
         _Var2._M_head_impl;
    if (pTVar1 != (TraceSource *)0x0) {
      (*(pTVar1->super_TraceSource)._vptr_TraceSource[1])();
      if (local_28._M_head_impl != (TraceSource *)0x0) {
        (*((local_28._M_head_impl)->super_TraceSource)._vptr_TraceSource[1])();
      }
    }
  }
  return;
}

Assistant:

Thread::Thread(Store& store, Stream* trace_stream)
    : store_(store), trace_stream_(trace_stream) {
  store.threads().insert(this);

  Thread::Options options;
  frames_.reserve(options.call_stack_size);
  values_.reserve(options.value_stack_size);
  if (trace_stream) {
    trace_source_ = std::make_unique<TraceSource>(this);
  }
}